

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

void __thiscall draco::PointCloud::DeleteAttribute(PointCloud *this,int att_id)

{
  bool bVar1;
  Type TVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
  *pvVar3;
  pointer this_00;
  PointAttribute *this_01;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  int in_ESI;
  const_iterator in_RDI;
  int j;
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  uint32_t unique_id;
  Type att_type;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  PointCloud *in_stack_ffffffffffffff70;
  __normal_iterator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_*,_std::vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>_>
  *this_02;
  int local_70;
  int local_6c;
  undefined8 in_stack_ffffffffffffff98;
  int32_t att_unique_id;
  GeometryMetadata *in_stack_ffffffffffffffa0;
  
  att_unique_id = (int32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (-1 < in_ESI) {
    __last._M_current = (int *)(long)in_ESI;
    pvVar3 = (vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
              *)std::
                vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ::size((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                        *)(in_RDI._M_current + 2));
    if (__last._M_current < pvVar3) {
      std::
      vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                    *)(in_RDI._M_current + 2),(long)in_ESI);
      this_00 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                ::operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                              *)0x19ca78);
      TVar2 = GeometryAttribute::attribute_type(&this_00->super_GeometryAttribute);
      this_01 = attribute(in_stack_ffffffffffffff70,
                          (int32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      GeometryAttribute::unique_id(&this_01->super_GeometryAttribute);
      this_02 = (__normal_iterator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_*,_std::vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>_>
                 *)(in_RDI._M_current + 2);
      std::
      vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
      ::begin((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               *)in_stack_ffffffffffffff68);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_*,_std::vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>_>
      ::operator+(this_02,(difference_type)in_stack_ffffffffffffff70);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>const*,std::vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>>
      ::
      __normal_iterator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>*>
                ((__normal_iterator<const_std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_*,_std::vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>_>
                  *)in_stack_ffffffffffffff70,
                 (__normal_iterator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_*,_std::vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>_>
                  *)in_stack_ffffffffffffff68);
      std::
      vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
      ::erase((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               *)__last._M_current,in_RDI);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                          *)0x19cb0e);
      if (bVar1) {
        std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
        operator->((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                    *)0x19cb22);
        GeometryMetadata::DeleteAttributeMetadataByUniqueId(in_stack_ffffffffffffffa0,att_unique_id)
        ;
      }
      if (TVar2 < NAMED_ATTRIBUTES_COUNT) {
        std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
        std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
        std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   in_RDI._M_current,__last,(int *)this_02);
        std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_ffffffffffffff70,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_ffffffffffffff68);
        if (bVar1) {
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     (in_RDI._M_current + (long)TVar2 * 3 + 5),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff68);
          std::vector<int,_std::allocator<int>_>::erase
                    ((vector<int,_std::allocator<int>_> *)__last._M_current,
                     (const_iterator)in_RDI._M_current);
        }
      }
      for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
        local_70 = 0;
        while( true ) {
          uVar4 = (ulong)local_70;
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             (in_RDI._M_current + (long)local_6c * 3 + 5));
          if (sVar5 <= uVar4) break;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              (in_RDI._M_current + (long)local_6c * 3 + 5),(long)local_70);
          if (in_ESI < *pvVar6) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                (in_RDI._M_current + (long)local_6c * 3 + 5),(long)local_70);
            *pvVar6 = *pvVar6 + -1;
          }
          local_70 = local_70 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void PointCloud::DeleteAttribute(int att_id) {
  if (att_id < 0 || att_id >= attributes_.size()) {
    return;  // Attribute does not exist.
  }
  const GeometryAttribute::Type att_type =
      attributes_[att_id]->attribute_type();
  const uint32_t unique_id = attribute(att_id)->unique_id();
  attributes_.erase(attributes_.begin() + att_id);
  // Remove metadata if applicable.
  if (metadata_) {
    metadata_->DeleteAttributeMetadataByUniqueId(unique_id);
  }

  // Remove the attribute from the named attribute list if applicable.
  if (att_type < GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
    const auto it = std::find(named_attribute_index_[att_type].begin(),
                              named_attribute_index_[att_type].end(), att_id);
    if (it != named_attribute_index_[att_type].end()) {
      named_attribute_index_[att_type].erase(it);
    }
  }

  // Update ids of all subsequent named attributes (decrease them by one).
  for (int i = 0; i < GeometryAttribute::NAMED_ATTRIBUTES_COUNT; ++i) {
    for (int j = 0; j < named_attribute_index_[i].size(); ++j) {
      if (named_attribute_index_[i][j] > att_id) {
        named_attribute_index_[i][j]--;
      }
    }
  }
}